

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O1

size_t phosg::fread_abi_cxx11_(void *__ptr,size_t __size,size_t __n,FILE *__stream)

{
  int fd;
  size_t __n_00;
  io_error *this;
  
  *(long *)__ptr = (long)__ptr + 0x10;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__ptr,__n,'\0');
  __n_00 = ::fread(*__ptr,1,__n,(FILE *)__size);
  if (-1 < (long)__n_00) {
    if (__n_00 != __n) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__ptr,__n_00,
                 '\0');
    }
    return (size_t)__ptr;
  }
  this = (io_error *)__cxa_allocate_exception(0x20);
  fd = fileno((FILE *)__size);
  io_error::io_error(this,fd);
  __cxa_throw(this,&io_error::typeinfo,io_error::~io_error);
}

Assistant:

string fread(FILE* f, size_t size) {
  string data(size, '\0');
  ssize_t ret_size = ::fread(data.data(), 1, size, f);
  if (ret_size < 0) {
    throw io_error(fileno(f));
  } else if (ret_size != static_cast<ssize_t>(size)) {
    data.resize(ret_size);
  }
  return data;
}